

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

string * Catch::toString(string *__return_storage_ptr__,string *value)

{
  undefined8 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  long lVar4;
  string *psVar5;
  char cVar6;
  IMutableContext *pIVar7;
  long *plVar8;
  undefined8 *puVar9;
  char *pcVar10;
  ulong *puVar11;
  size_type *psVar12;
  ulong uVar13;
  ulong uVar14;
  string subs;
  string s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  ulong *local_d8;
  long local_d0;
  ulong local_c8 [2];
  ulong *local_b8;
  long local_b0;
  ulong local_a8;
  long lStack_a0;
  undefined8 *local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string *local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  pcVar3 = (value->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar3,pcVar3 + value->_M_string_length);
  pIVar7 = getCurrentMutableContext();
  (*(pIVar7->super_IContext)._vptr_IContext[6])(&local_f8);
  cVar6 = (**(code **)(*(size_type *)local_f8._M_dataplus._M_p + 0x58))();
  local_58 = __return_storage_ptr__;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    (**(code **)(*(size_type *)local_f8._M_dataplus._M_p + 0x18))();
  }
  if ((cVar6 != '\0') && (local_78._M_string_length != 0)) {
    paVar2 = &local_f8.field_2;
    uVar14 = 0;
    do {
      local_f8._M_string_length = 0;
      local_f8.field_2._M_local_buf[0] = '\0';
      local_f8._M_dataplus._M_p = (pointer)paVar2;
      if (local_78._M_dataplus._M_p[uVar14] == '\t') {
        pcVar10 = "\\t";
LAB_0013aa8a:
        std::__cxx11::string::_M_replace((ulong)&local_f8,0,(char *)0x0,(ulong)pcVar10);
      }
      else {
        pcVar10 = "\\n";
        if (local_78._M_dataplus._M_p[uVar14] == '\n') goto LAB_0013aa8a;
      }
      if (local_f8._M_string_length != 0) {
        std::__cxx11::string::substr((ulong)local_50,(ulong)&local_78);
        plVar8 = (long *)std::__cxx11::string::_M_append
                                   ((char *)local_50,(ulong)local_f8._M_dataplus._M_p);
        puVar11 = (ulong *)(plVar8 + 2);
        if ((ulong *)*plVar8 == puVar11) {
          local_a8 = *puVar11;
          lStack_a0 = plVar8[3];
          local_b8 = &local_a8;
        }
        else {
          local_a8 = *puVar11;
          local_b8 = (ulong *)*plVar8;
        }
        local_b0 = plVar8[1];
        *plVar8 = (long)puVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        uVar14 = uVar14 + 1;
        std::__cxx11::string::substr((ulong)&local_d8,(ulong)&local_78);
        uVar13 = 0xf;
        if (local_b8 != &local_a8) {
          uVar13 = local_a8;
        }
        if (uVar13 < (ulong)(local_d0 + local_b0)) {
          uVar13 = 0xf;
          if (local_d8 != local_c8) {
            uVar13 = local_c8[0];
          }
          if (uVar13 < (ulong)(local_d0 + local_b0)) goto LAB_0013ab67;
          puVar9 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,(ulong)local_b8);
        }
        else {
LAB_0013ab67:
          puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_d8);
        }
        puVar1 = puVar9 + 2;
        if ((undefined8 *)*puVar9 == puVar1) {
          local_88 = *puVar1;
          uStack_80 = puVar9[3];
          local_98 = &local_88;
        }
        else {
          local_88 = *puVar1;
          local_98 = (undefined8 *)*puVar9;
        }
        local_90 = puVar9[1];
        *puVar9 = puVar1;
        puVar9[1] = 0;
        *(undefined1 *)puVar1 = 0;
        std::__cxx11::string::operator=((string *)&local_78,(string *)&local_98);
        if (local_98 != &local_88) {
          operator_delete(local_98);
        }
        if (local_d8 != local_c8) {
          operator_delete(local_d8);
        }
        if (local_b8 != &local_a8) {
          operator_delete(local_b8);
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != paVar2) {
        operator_delete(local_f8._M_dataplus._M_p);
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 < local_78._M_string_length);
  }
  std::operator+(&local_f8,"\"",&local_78);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_f8);
  psVar5 = local_58;
  (local_58->_M_dataplus)._M_p = (pointer)&local_58->field_2;
  psVar12 = (size_type *)(plVar8 + 2);
  if ((size_type *)*plVar8 == psVar12) {
    lVar4 = plVar8[3];
    (local_58->field_2)._M_allocated_capacity = *psVar12;
    *(long *)((long)&local_58->field_2 + 8) = lVar4;
  }
  else {
    (local_58->_M_dataplus)._M_p = (pointer)*plVar8;
    (local_58->field_2)._M_allocated_capacity = *psVar12;
  }
  local_58->_M_string_length = plVar8[1];
  *plVar8 = (long)psVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  return psVar5;
}

Assistant:

std::string toString( std::string const& value ) {
    std::string s = value;
    if( getCurrentContext().getConfig()->showInvisibles() ) {
        for(size_t i = 0; i < s.size(); ++i ) {
            std::string subs;
            switch( s[i] ) {
            case '\n': subs = "\\n"; break;
            case '\t': subs = "\\t"; break;
            default: break;
            }
            if( !subs.empty() ) {
                s = s.substr( 0, i ) + subs + s.substr( i+1 );
                ++i;
            }
        }
    }
    return "\"" + s + "\"";
}